

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O1

size_t __thiscall diy::FileStorage::max_size(FileStorage *this)

{
  size_t sVar1;
  unique_lock<tthread::fast_mutex> local_18;
  
  local_18._M_device = &(this->max_size_).m_;
  local_18._M_owns = false;
  std::unique_lock<tthread::fast_mutex>::lock(&local_18);
  sVar1 = (this->max_size_).x_;
  if (local_18._M_device != (fast_mutex *)0x0) {
    LOCK();
    (local_18._M_device)->mLock = 0;
    UNLOCK();
  }
  return sVar1;
}

Assistant:

size_t        max_size() const            { return (*max_size_.const_access()); }